

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

type __thiscall
c4::yml::Tree::to_arena<c4::fmt::base64_wrapper_<char_const>>
          (Tree *this,base64_wrapper_<const_char> *a)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  code *pcVar5;
  size_t sVar6;
  bool bVar7;
  size_t more;
  substr sVar8;
  type tVar9;
  basic_substring<char> local_50;
  undefined8 local_40;
  csubstr cStack_38;
  
  uVar1 = this->m_arena_pos;
  uVar2 = (this->m_arena).len;
  if (uVar2 < uVar1) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar5 = (code *)swi(3);
        tVar9 = (type)(*pcVar5)();
        return tVar9;
      }
    }
    handle_error(0x1e6196,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_50,(this->m_arena).str + uVar1,uVar2 - uVar1);
  sVar6 = local_50.len;
  uVar3 = *(undefined8 *)a;
  uVar4 = *(undefined8 *)(a + 8);
  more = base64_encode(local_50.str,local_50.len,uVar3,uVar4);
  if (sVar6 < more) {
    sVar8 = _grow_arena(this,more);
    more = base64_encode(sVar8.str,sVar8.len,uVar3,uVar4);
    if (sVar8.len < more) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar5 = (code *)swi(3);
          tVar9 = (type)(*pcVar5)();
          return tVar9;
        }
      }
      cStack_38 = to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
      local_50.str = (char *)0x0;
      local_50.len = 0x4d80;
      local_40 = 0;
      (*(code *)PTR_error_impl_0022f4f8)
                ("check failed: num <= rem.len",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
  }
  sVar8 = _request_span(this,more);
  tVar9.str = sVar8.str;
  tVar9.len = sVar8.len;
  return tVar9;
}

Assistant:

typename std::enable_if<!std::is_floating_point<T>::value, csubstr>::type
    to_arena(T const& C4_RESTRICT a)
    {
        substr rem(m_arena.sub(m_arena_pos));
        size_t num = to_chars(rem, a);
        if(num > rem.len)
        {
            rem = _grow_arena(num);
            num = to_chars(rem, a);
            RYML_ASSERT(num <= rem.len);
        }
        rem = _request_span(num);
        return rem;
    }